

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

char * cimg_library::cimg::load_network
                 (char *url,char *filename_local,uint timeout,bool try_fallback)

{
  int iVar1;
  CImgArgumentException *pCVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  ulong uVar7;
  cimg *pcVar8;
  CImgIOException *pCVar9;
  long lVar10;
  char *local_a0;
  undefined1 local_88 [8];
  CImg<char> command;
  FILE *file;
  CImg<char> ext;
  char *_ext;
  char *__ext;
  bool local_1d;
  uint local_1c;
  bool try_fallback_local;
  char *pcStack_18;
  uint timeout_local;
  char *filename_local_local;
  char *url_local;
  
  local_1d = try_fallback;
  local_1c = timeout;
  pcStack_18 = filename_local;
  filename_local_local = url;
  if (url == (char *)0x0) {
    pCVar2 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    CImgArgumentException::CImgArgumentException
              (pCVar2,"cimg::load_network(): Specified URL is (null).");
    __cxa_throw(pCVar2,&CImgArgumentException::typeinfo,
                CImgArgumentException::~CImgArgumentException);
  }
  if (filename_local == (char *)0x0) {
    pCVar2 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    CImgArgumentException::CImgArgumentException
              (pCVar2,"cimg::load_network(): Specified destination string is (null).");
    __cxa_throw(pCVar2,&CImgArgumentException::typeinfo,
                CImgArgumentException::~CImgArgumentException);
  }
  local_a0 = split_filename(url,(char *)0x0);
  if ((*local_a0 != '\0') && (filename_local_local < local_a0)) {
    local_a0 = local_a0 + -1;
  }
  ext._data = local_a0;
  CImg<char>::string((CImg<char> *)&file,local_a0,true,false);
  command._data = (char *)0x0;
  *pcStack_18 = '\0';
  if ((uint)file < 0x11) {
    pcVar3 = cimg_library::CImg::operator_cast_to_char_((CImg *)&file);
    iVar1 = strncasecmp(pcVar3,"cgi",3);
    if (iVar1 != 0) {
      pcVar3 = cimg_library::CImg::operator_cast_to_char_((CImg *)&file);
      strwindows_reserved(pcVar3,'_');
      goto LAB_0013d0f0;
    }
  }
  pcVar3 = cimg_library::CImg::operator_cast_to_char_((CImg *)&file);
  *pcVar3 = '\0';
LAB_0013d0f0:
  do {
    pcVar3 = pcStack_18;
    pcVar4 = temporary_path((char *)0x0,false);
    pcVar5 = filenamerand();
    snprintf(pcVar3,0x100,"%s%c%s%s",pcVar4,0x2f,pcVar5,ext._16_8_);
    command._data = (char *)::fopen(pcStack_18,"rb");
    if ((FILE *)command._data != (FILE *)0x0) {
      fclose((FILE *)command._data);
    }
  } while (command._data != (char *)0x0);
  sVar6 = strlen(filename_local_local);
  CImg<char>::CImg((CImg<char> *)local_88,(int)sVar6 + 0x40,1,1,1);
  unused<bool>(&local_1d);
  if (local_1c == 0) {
    pcVar3 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_88);
    uVar7 = (ulong)(uint)local_88._0_4_;
    pcVar4 = curl_path((char *)0x0,false);
    snprintf(pcVar3,uVar7,"%s -f --silent --compressed -o \"%s\" \"%s\"",pcVar4,pcStack_18,
             filename_local_local);
  }
  else {
    pcVar3 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_88);
    uVar7 = (ulong)(uint)local_88._0_4_;
    pcVar4 = curl_path((char *)0x0,false);
    snprintf(pcVar3,uVar7,"%s -m %u -f --silent --compressed -o \"%s\" \"%s\"",pcVar4,
             (ulong)local_1c,pcStack_18,filename_local_local);
  }
  pcVar8 = (cimg *)cimg_library::CImg::operator_cast_to_char_((CImg *)local_88);
  system(pcVar8,(char *)0x0);
  command._data = (char *)::fopen(pcStack_18,"rb");
  if ((FILE *)command._data == (FILE *)0x0) {
    if (local_1c == 0) {
      pcVar3 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_88);
      uVar7 = (ulong)(uint)local_88._0_4_;
      pcVar4 = wget_path((char *)0x0,false);
      snprintf(pcVar3,uVar7,"%s -q -r -l 0 --no-cache -O \"%s\" \"%s\"",pcVar4,pcStack_18,
               filename_local_local);
    }
    else {
      pcVar3 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_88);
      uVar7 = (ulong)(uint)local_88._0_4_;
      pcVar4 = wget_path((char *)0x0,false);
      snprintf(pcVar3,uVar7,"%s -T %u -q -r -l 0 --no-cache -O \"%s\" \"%s\"",pcVar4,(ulong)local_1c
               ,pcStack_18,filename_local_local);
    }
    pcVar8 = (cimg *)cimg_library::CImg::operator_cast_to_char_((CImg *)local_88);
    system(pcVar8,(char *)0x0);
    command._data = (char *)::fopen(pcStack_18,"rb");
    if ((FILE *)command._data == (FILE *)0x0) {
      pCVar9 = (CImgIOException *)__cxa_allocate_exception(0x10);
      CImgIOException::CImgIOException
                (pCVar9,
                 "cimg::load_network(): Failed to load file \'%s\' with external commands \'wget\' or \'curl\'."
                 ,filename_local_local);
      __cxa_throw(pCVar9,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
    }
    fclose((FILE *)command._data);
    pcVar3 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_88);
    snprintf(pcVar3,(ulong)(uint)local_88._0_4_,"%s.gz",pcStack_18);
    pcVar3 = pcStack_18;
    pcVar4 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_88);
    rename(pcVar3,pcVar4);
    pcVar3 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_88);
    uVar7 = (ulong)(uint)local_88._0_4_;
    pcVar4 = gunzip_path((char *)0x0,false);
    snprintf(pcVar3,uVar7,"%s --quiet \"%s.gz\"",pcVar4,pcStack_18);
    pcVar8 = (cimg *)cimg_library::CImg::operator_cast_to_char_((CImg *)local_88);
    system(pcVar8,(char *)0x0);
    command._data = (char *)::fopen(pcStack_18,"rb");
    if ((FILE *)command._data == (FILE *)0x0) {
      pcVar3 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_88);
      snprintf(pcVar3,(ulong)(uint)local_88._0_4_,"%s.gz",pcStack_18);
      pcVar3 = cimg_library::CImg::operator_cast_to_char_((CImg *)local_88);
      rename(pcVar3,pcStack_18);
      command._data = (char *)::fopen(pcStack_18,"rb");
    }
  }
  fseek((FILE *)command._data,0,2);
  lVar10 = ftell((FILE *)command._data);
  if (0 < lVar10) {
    fclose((FILE *)command._data);
    pcVar3 = pcStack_18;
    CImg<char>::~CImg((CImg<char> *)local_88);
    CImg<char>::~CImg((CImg<char> *)&file);
    return pcVar3;
  }
  pCVar9 = (CImgIOException *)__cxa_allocate_exception(0x10);
  CImgIOException::CImgIOException
            (pCVar9,
             "cimg::load_network(): Failed to load URL \'%s\' with external commands \'wget\' or \'curl\'."
             ,filename_local_local);
  __cxa_throw(pCVar9,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
}

Assistant:

inline char *load_network(const char *const url, char *const filename_local,
                            const unsigned int timeout, const bool try_fallback) {
    if (!url)
      throw CImgArgumentException("cimg::load_network(): Specified URL is (null).");
    if (!filename_local)
      throw CImgArgumentException("cimg::load_network(): Specified destination string is (null).");

    const char *const __ext = cimg::split_filename(url), *const _ext = (*__ext && __ext>url)?__ext - 1:__ext;
    CImg<char> ext = CImg<char>::string(_ext);
    std::FILE *file = 0;
    *filename_local = 0;
    if (ext._width>16 || !cimg::strncasecmp(ext,"cgi",3)) *ext = 0;
    else cimg::strwindows_reserved(ext);
    do {
      cimg_snprintf(filename_local,256,"%s%c%s%s",
                    cimg::temporary_path(),cimg_file_separator,cimg::filenamerand(),ext._data);
      if ((file=std::fopen(filename_local,"rb"))!=0) cimg::fclose(file);
    } while (file);

#ifdef cimg_use_curl
    const unsigned int omode = cimg::exception_mode();
    cimg::exception_mode(0);
    try {
      CURL *curl = 0;
      CURLcode res;
      curl = curl_easy_init();
      if (curl) {
        file = cimg::fopen(filename_local,"wb");
        curl_easy_setopt(curl,CURLOPT_URL,url);
        curl_easy_setopt(curl,CURLOPT_WRITEFUNCTION,0);
        curl_easy_setopt(curl,CURLOPT_WRITEDATA,file);
        curl_easy_setopt(curl,CURLOPT_SSL_VERIFYPEER,0L);
        curl_easy_setopt(curl,CURLOPT_SSL_VERIFYHOST,0L);
        curl_easy_setopt(curl,CURLOPT_FOLLOWLOCATION,1L);
        if (timeout) curl_easy_setopt(curl,CURLOPT_TIMEOUT,(long)timeout);
        if (std::strchr(url,'?')) curl_easy_setopt(curl,CURLOPT_HTTPGET,1L);
        res = curl_easy_perform(curl);
        curl_easy_cleanup(curl);
        std::fseek(file,0,SEEK_END); // Check if file size is 0.
        const long siz = std::ftell(file);
        cimg::fclose(file);
        if (siz>0 && res==CURLE_OK) {
          cimg::exception_mode(omode);
          return filename_local;
        } else std::remove(filename_local);
      }
    } catch (...) { }
    cimg::exception_mode(omode);
    if (!try_fallback) throw CImgIOException("cimg::load_network(): Failed to load file '%s' with libcurl.",url);
#endif

    CImg<char> command((unsigned int)std::strlen(url) + 64);
    cimg::unused(try_fallback);

    // Try with 'curl' first.
    if (timeout)
      cimg_snprintf(command,command._width,"%s -m %u -f --silent --compressed -o \"%s\" \"%s\"",
                    cimg::curl_path(),timeout,filename_local,url);
    else
      cimg_snprintf(command,command._width,"%s -f --silent --compressed -o \"%s\" \"%s\"",
                    cimg::curl_path(),filename_local,url);
    cimg::system(command);

    if (!(file = std::fopen(filename_local,"rb"))) {

      // Try with 'wget' otherwise.
      if (timeout)
        cimg_snprintf(command,command._width,"%s -T %u -q -r -l 0 --no-cache -O \"%s\" \"%s\"",
                      cimg::wget_path(),timeout,filename_local,url);
      else
        cimg_snprintf(command,command._width,"%s -q -r -l 0 --no-cache -O \"%s\" \"%s\"",
                      cimg::wget_path(),filename_local,url);
      cimg::system(command);

      if (!(file = std::fopen(filename_local,"rb")))
        throw CImgIOException("cimg::load_network(): Failed to load file '%s' with external commands "
                              "'wget' or 'curl'.",url);
      cimg::fclose(file);

      // Try gunzip it.
      cimg_snprintf(command,command._width,"%s.gz",filename_local);
      std::rename(filename_local,command);
      cimg_snprintf(command,command._width,"%s --quiet \"%s.gz\"",
                    gunzip_path(),filename_local);
      cimg::system(command);
      file = std::fopen(filename_local,"rb");
      if (!file) {
        cimg_snprintf(command,command._width,"%s.gz",filename_local);
        std::rename(command,filename_local);
        file = std::fopen(filename_local,"rb");
      }
    }
    std::fseek(file,0,SEEK_END); // Check if file size is 0.
    if (std::ftell(file)<=0)
      throw CImgIOException("cimg::load_network(): Failed to load URL '%s' with external commands "
                            "'wget' or 'curl'.",url);
    cimg::fclose(file);
    return filename_local;
  }